

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

int __thiscall asl::Array<asl::Socket>::dup(Array<asl::Socket> *this,int __fd)

{
  Socket *pSVar1;
  Socket *in_RAX;
  Socket *p;
  Array<asl::Socket> b;
  Array<asl::Socket> local_18;
  
  p = this->_a;
  if (*(int *)&p[-1].super_SmartObject._p != 1) {
    local_18._a = in_RAX;
    Array(&local_18,p,*(int *)&p[-2].super_SmartObject._p);
    if (this->_a != local_18._a) {
      LOCK();
      pSVar1 = this->_a + -1;
      *(int *)&(pSVar1->super_SmartObject)._p = *(int *)&(pSVar1->super_SmartObject)._p + -1;
      UNLOCK();
      if (*(int *)&(pSVar1->super_SmartObject)._p == 0) {
        free(this,p);
      }
      this->_a = (Socket *)local_18;
      LOCK();
      *(int *)&local_18._a[-1].super_SmartObject._p =
           *(int *)&local_18._a[-1].super_SmartObject._p + 1;
      UNLOCK();
    }
    ~Array(&local_18);
  }
  return (int)this;
}

Assistant:

Array& dup()
	{
		if(d().rc==1) return *this;
		return (*this = clone());
	}